

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O3

int __thiscall
cnn::SimpleRNNBuilder::copy(SimpleRNNBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  EVP_PKEY_CTX *extraout_RDX;
  ulong uVar2;
  long lVar3;
  
  lVar1 = *(long *)(dst + 0x28);
  src_00 = (EVP_PKEY_CTX *)
           ((long)(this->params).
                  super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->params).
                 super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  if (src_00 == (EVP_PKEY_CTX *)(*(long *)(dst + 0x30) - lVar1)) {
    if (*(long *)(dst + 0x30) != lVar1) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        Parameters::copy((Parameters *)
                         **(undefined8 **)
                           ((long)&(((this->params).
                                     super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                   )._M_impl.super__Vector_impl_data + lVar3),
                         (EVP_PKEY_CTX *)**(undefined8 **)(lVar1 + lVar3),src_00);
        Parameters::copy(*(Parameters **)
                          (*(long *)((long)&(((this->params).
                                              super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                            )._M_impl.super__Vector_impl_data + lVar3) + 8),
                         *(EVP_PKEY_CTX **)(*(long *)(*(long *)(dst + 0x28) + lVar3) + 8),src_01);
        Parameters::copy(*(Parameters **)
                          (*(long *)((long)&(((this->params).
                                              super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                            )._M_impl.super__Vector_impl_data + lVar3) + 0x10),
                         *(EVP_PKEY_CTX **)(*(long *)(*(long *)(dst + 0x28) + lVar3) + 0x10),src_02)
        ;
        lVar1 = *(long *)(dst + 0x28);
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x18;
        src_00 = extraout_RDX;
      } while (uVar2 < (ulong)((*(long *)(dst + 0x30) - lVar1 >> 3) * -0x5555555555555555));
    }
    return (int)lVar1;
  }
  __assert_fail("params.size() == rnn_simple.params.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/rnn.cc"
                ,0x72,"virtual void cnn::SimpleRNNBuilder::copy(const RNNBuilder &)");
}

Assistant:

void SimpleRNNBuilder::copy(const RNNBuilder & rnn) {
  const SimpleRNNBuilder & rnn_simple = (const SimpleRNNBuilder&)rnn;
  assert(params.size() == rnn_simple.params.size());
  for(size_t i = 0; i < rnn_simple.params.size(); ++i) {
      params[i][0]->copy(*rnn_simple.params[i][0]);
      params[i][1]->copy(*rnn_simple.params[i][1]);
      params[i][2]->copy(*rnn_simple.params[i][2]);
  }
}